

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O2

AdsHandle * __thiscall
AdsDevice::OpenFile(AdsHandle *__return_storage_ptr__,AdsDevice *this,string *filename,
                   uint32_t flags)

{
  long adsErrorCode;
  pointer __p;
  AdsException *this_00;
  uint local_80;
  uint32_t bytesRead;
  function<long_(unsigned_int)> local_78;
  function<long_(unsigned_int)> local_58;
  _Bind<long_(AdsDevice::*(const_AdsDevice_*,_std::_Placeholder<1>))(unsigned_int)_const> local_38;
  
  bytesRead = 0;
  adsErrorCode = ReadWriteReqEx2(this,0x78,flags,4,&local_80,filename->_M_string_length,
                                 (filename->_M_dataplus)._M_p,&bytesRead);
  if (adsErrorCode == 0) {
    __p = (pointer)operator_new(4);
    *__p = local_80;
    local_38._M_f = (offset_in_AdsDevice_to_subr)CloseFile;
    local_38._8_8_ = 0;
    local_38._M_bound_args.super__Tuple_impl<0UL,_const_AdsDevice_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_const_AdsDevice_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_AdsDevice_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_const_AdsDevice_*,_std::_Placeholder<1>_>)this;
    std::function<long(unsigned_int)>::
    function<std::_Bind<long(AdsDevice::*(AdsDevice_const*,std::_Placeholder<1>))(unsigned_int)const>,void>
              ((function<long(unsigned_int)> *)&local_78,&local_38);
    std::function<long_(unsigned_int)>::function(&local_58,&local_78);
    std::unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>>::
    unique_ptr<ResourceDeleter<unsigned_int>,void>
              ((unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>> *)__return_storage_ptr__,__p,
               (__enable_if_t<_is_lvalue_reference<ResourceDeleter<unsigned_int>_>::value,_ResourceDeleter<unsigned_int>_&&>
                )&local_58);
    std::_Function_base::~_Function_base(&local_58.super__Function_base);
    std::_Function_base::~_Function_base(&local_78.super__Function_base);
    return __return_storage_ptr__;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsHandle AdsDevice::OpenFile(const std::string& filename, const uint32_t flags) const
{
    uint32_t bytesRead = 0;
    uint32_t handle;
    const auto error = ReadWriteReqEx2(SYSTEMSERVICE_FOPEN,
                                       flags,
                                       sizeof(handle),
                                       &handle,
                                       filename.length(),
                                       filename.c_str(),
                                       &bytesRead);

    if (error) {
        throw AdsException(error);
    }
    handle = bhf::ads::letoh(handle);
    return {new uint32_t {handle}, {std::bind(&AdsDevice::CloseFile, this, std::placeholders::_1)}};
}